

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void closetags(void)

{
  char **ppcVar1;
  tagstack __ptr;
  tagpos *s;
  
  while (__ptr.slh_first = shead.slh_first, shead.slh_first != (tagpos *)0x0) {
    ppcVar1 = &(shead.slh_first)->bname;
    shead.slh_first = ((shead.slh_first)->entry).sle_next;
    free(*ppcVar1);
    free(__ptr.slh_first);
  }
  unloadtags();
  return;
}

Assistant:

void
closetags(void)
{
	struct tagpos *s;

	while (!SLIST_EMPTY(&shead)) {
		s = SLIST_FIRST(&shead);
		SLIST_REMOVE_HEAD(&shead, entry);
		free(s->bname);
		free(s);
	}
	unloadtags();
}